

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

PFunction *
FindClassMemberFunction
          (PStruct *selfcls,PStruct *funccls,FName *name,FScriptPosition *sc,bool *error)

{
  PNamedType *pPVar1;
  bool *pbVar2;
  bool bVar3;
  PStruct *pPVar4;
  char *pcVar5;
  char *pcVar6;
  Variant *pVVar7;
  PFunction *funcsym;
  DObject *local_48;
  PSymbol *symbol;
  PSymbolTable *symtable;
  bool *error_local;
  FScriptPosition *sc_local;
  FName *name_local;
  PStruct *funccls_local;
  PStruct *selfcls_local;
  
  symtable = (PSymbolTable *)error;
  error_local = (bool *)sc;
  sc_local = (FScriptPosition *)name;
  name_local = (FName *)funccls;
  funccls_local = selfcls;
  bVar3 = FName::operator==(name,NAME_ACS_NamedExecuteWithResult);
  if (bVar3) {
    selfcls_local = (PStruct *)0x0;
  }
  else {
    pPVar1 = &funccls_local->super_PNamedType;
    FName::FName((FName *)((long)&funcsym + 4),name);
    local_48 = (DObject *)
               PSymbolTable::FindSymbolInTable
                         (&(pPVar1->super_PCompoundType).super_PType.Symbols,
                          (FName *)((long)&funcsym + 4),(PSymbolTable **)&symbol);
    pPVar4 = (PStruct *)dyn_cast<PFunction>(local_48);
    pbVar2 = error_local;
    selfcls_local = pPVar4;
    if (local_48 != (DObject *)0x0) {
      if (pPVar4 == (PStruct *)0x0) {
        pcVar5 = FName::GetChars(name);
        pcVar6 = FName::GetChars(&(funccls_local->super_PNamedType).TypeName);
        FScriptPosition::Message
                  ((FScriptPosition *)pbVar2,2,"%s is not a member function of %s",pcVar5,pcVar6);
      }
      else {
        pVVar7 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                           ((TArray<PFunction::Variant,_PFunction::Variant> *)
                            &(pPVar4->super_PNamedType).super_PCompoundType.super_PType.Align,0);
        pbVar2 = error_local;
        if (((pVVar7->Flags & 0x20) == 0) || (symbol == (PSymbol *)(name_local + 0xe))) {
          pVVar7 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                             ((TArray<PFunction::Variant,_PFunction::Variant> *)
                              &(pPVar4->super_PNamedType).super_PCompoundType.super_PType.Align,0);
          pbVar2 = error_local;
          if ((pVVar7->Flags & 0x80) != 0) {
            pcVar5 = FName::GetChars((FName *)&local_48->field_0x24);
            FScriptPosition::Message
                      ((FScriptPosition *)pbVar2,0,"Call to deprecated function %s",pcVar5);
          }
        }
        else {
          pcVar5 = FName::GetChars((FName *)&local_48->field_0x24);
          FScriptPosition::Message
                    ((FScriptPosition *)pbVar2,2,"%s is declared private and not accessible",pcVar5)
          ;
        }
      }
    }
  }
  return (PFunction *)selfcls_local;
}

Assistant:

PFunction *FindClassMemberFunction(PStruct *selfcls, PStruct *funccls, FName name, FScriptPosition &sc, bool *error)
{
	// Skip ACS_NamedExecuteWithResult. Anything calling this should use the builtin instead.
	if (name == NAME_ACS_NamedExecuteWithResult) return nullptr;

	PSymbolTable *symtable;
	auto symbol = selfcls->Symbols.FindSymbolInTable(name, symtable);
	auto funcsym = dyn_cast<PFunction>(symbol);

	if (symbol != nullptr)
	{
		if (funcsym == nullptr)
		{
			sc.Message(MSG_ERROR, "%s is not a member function of %s", name.GetChars(), selfcls->TypeName.GetChars());
		}
		else if (funcsym->Variants[0].Flags & VARF_Private && symtable != &funccls->Symbols)
		{
			// private access is only allowed if the symbol table belongs to the class in which the current function is being defined.
			sc.Message(MSG_ERROR, "%s is declared private and not accessible", symbol->SymbolName.GetChars());
		}
		else if (funcsym->Variants[0].Flags & VARF_Deprecated)
		{
			sc.Message(MSG_WARNING, "Call to deprecated function %s", symbol->SymbolName.GetChars());
		}
	}
	// return nullptr if the name cannot be found in the symbol table so that the calling code can do other checks.
	return funcsym;
}